

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

optional<bool> __thiscall ArgsManager::GetBoolArg(ArgsManager *this,string *strArg)

{
  long lVar1;
  _Optional_base<bool,_true,_true> _Var2;
  long in_FS_OFFSET;
  SettingsValue value;
  UniValue *in_stack_ffffffffffffff58;
  SettingsValue *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffffa8;
  ArgsManager *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  _Var2._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload<bool,_true,_true,_true>)SettingToBool(in_stack_ffffffffffffff60);
  UniValue::~UniValue(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<bool,_true,_true>)
           (_Optional_base<bool,_true,_true>)_Var2._M_payload.super__Optional_payload_base<bool>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<bool> ArgsManager::GetBoolArg(const std::string& strArg) const
{
    const common::SettingsValue value = GetSetting(strArg);
    return SettingToBool(value);
}